

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronTest.cpp
# Opt level: O0

void __thiscall Neuron_testApply_Test::TestBody(Neuron_testApply_Test *this)

{
  bool bVar1;
  char *message;
  char *pcVar2;
  float fVar3;
  AssertHelper local_120;
  Message local_118;
  float local_110;
  int local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_d8;
  Message local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_;
  Message local_b0 [3];
  float local_98;
  float local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  Neuron n;
  Neuron_testApply_Test *this_local;
  
  Neuron::Neuron((Neuron *)&gtest_ar.message_,10.0,1.0,50.0);
  local_94 = 0.0;
  local_98 = Neuron::syn((Neuron *)&gtest_ar.message_);
  pcVar2 = (char *)0x0;
  testing::internal::EqHelper<true>::Compare<int,float>
            (local_90,"0",(int *)"n.syn()",&local_94,&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x5f,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  fVar3 = Neuron::mem((Neuron *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_c8,fVar3 < 0.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_c8,(AssertionResult *)"n.mem() < 0",
               "false","true",pcVar2);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x60,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  Neuron::apply((Neuron *)&gtest_ar.message_,100.0,(Connection *)0x0);
  local_10c = 100;
  local_110 = Neuron::syn((Neuron *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<int,float>
            ((EqHelper<false> *)local_108,"100","n.syn()",&local_10c,&local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x62,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  Neuron::~Neuron((Neuron *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(Neuron, testApply)
{
    Neuron n;
    EXPECT_EQ(0, n.syn());
    EXPECT_TRUE(n.mem() < 0);
    n.apply(100);
    EXPECT_EQ(100, n.syn());
}